

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

LogEst sqlite3LogEst(u64 x)

{
  short sVar1;
  ulong uVar2;
  u64 uVar3;
  bool bVar4;
  
  if (x < 8) {
    if (x < 2) {
      return 0;
    }
    sVar1 = 0x28;
    do {
      sVar1 = sVar1 + -10;
      uVar2 = x * 2;
      bVar4 = x < 4;
      x = uVar2;
    } while (bVar4);
  }
  else {
    sVar1 = 0x28;
    if (0xff < x) {
      sVar1 = 0x28;
      uVar3 = x;
      do {
        sVar1 = sVar1 + 0x28;
        x = uVar3 >> 4;
        bVar4 = 0xfff < uVar3;
        uVar3 = x;
      } while (bVar4);
    }
    uVar2 = x;
    if (0xf < x) {
      do {
        sVar1 = sVar1 + 10;
        uVar2 = x >> 1;
        bVar4 = 0x1f < x;
        x = uVar2;
      } while (bVar4);
    }
  }
  return sVar1 + sqlite3LogEst::a[(uint)uVar2 & 7] + -10;
}

Assistant:

SQLITE_PRIVATE LogEst sqlite3LogEst(u64 x){
  static LogEst a[] = { 0, 2, 3, 5, 6, 7, 8, 9 };
  LogEst y = 40;
  if( x<8 ){
    if( x<2 ) return 0;
    while( x<8 ){  y -= 10; x <<= 1; }
  }else{
#if GCC_VERSION>=5004000
    int i = 60 - __builtin_clzll(x);
    y += i*10;
    x >>= i;
#else
    while( x>255 ){ y += 40; x >>= 4; }  /*OPTIMIZATION-IF-TRUE*/
    while( x>15 ){  y += 10; x >>= 1; }
#endif
  }
  return a[x&7] + y - 10;
}